

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O2

void SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(int *colVals,int *rowPtr,int *consP,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int i;
  double *pdVar36;
  double *pdVar37;
  Real *pRVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  int n;
  long lVar43;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dStack_760;
  double dStack_750;
  double dStack_740;
  double local_718 [10];
  double local_6c8;
  double local_6b8;
  double dStack_6b0;
  double local_6a8;
  undefined8 uStack_6a0;
  GpuArray<double,_9U> conc;
  double local_648 [5];
  undefined1 auStack_620 [16];
  undefined1 local_610 [24];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  double local_5d8;
  Real h_RT [9];
  double local_4c8 [54];
  undefined1 auStack_318 [16];
  double local_308;
  double local_300;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double local_2d0;
  double dStack_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_298;
  double local_290;
  double dStack_288;
  undefined1 local_280 [16];
  double local_270;
  double local_268;
  double local_260;
  double local_1f8 [2];
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  double dStack_1e0;
  double dStack_1d8;
  double local_1d0;
  double dStack_1c8;
  double local_1c0;
  double local_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  double dStack_190;
  Real local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_160;
  double local_158;
  double local_150;
  Real c_R [9];
  Real dcRdT [9];
  double dStack_80;
  Real local_78 [9];
  
  pdVar37 = local_4c8;
  memset(pdVar37,0,800);
  conc.arr[6] = 0.0;
  conc.arr[7] = 0.0;
  conc.arr[4] = 0.0;
  conc.arr[5] = 0.0;
  conc.arr[2] = 0.0;
  conc.arr[3] = 0.0;
  conc.arr[0] = 0.0;
  conc.arr[1] = 0.0;
  conc.arr[8] = 0.0;
  for (lVar43 = 0; dVar17 = conc.arr[3], dVar81 = conc.arr[2], dVar72 = conc.arr[0], lVar43 != 9;
      lVar43 = lVar43 + 1) {
    conc.arr[lVar43] = 0.1111111111111111;
  }
  iVar42 = *consP;
  for (lVar43 = 0; lVar43 != 100; lVar43 = lVar43 + 1) {
    local_4c8[lVar43] = 0.0;
  }
  for (lVar43 = 0; lVar43 != 9; lVar43 = lVar43 + 1) {
    local_718[lVar43] = 0.0;
  }
  dVar61 = 0.0;
  for (lVar43 = 0; lVar43 != 9; lVar43 = lVar43 + 1) {
    dVar61 = dVar61 + conc.arr[lVar43];
  }
  h_RT[0] = 2.911342024497792;
  h_RT[1] = 3.254512984911126;
  h_RT[2] = -15.528347679998124;
  h_RT[3] = 19.481084666666668;
  h_RT[4] = 22.009669090999374;
  h_RT[5] = 5.94295186894925;
  h_RT[6] = 5.3818731557687505;
  h_RT[7] = -5.101694818407498;
  h_RT[8] = 3.0794232161958335;
  local_6a8 = conc.arr[1];
  uStack_6a0 = 0;
  local_5f8._8_8_ = 0;
  local_5f8._0_8_ = conc.arr[1] * conc.arr[3];
  dVar73 = (((conc.arr[2] * 10.0 + conc.arr[1] * -0.21999999999999997 + dVar61 + conc.arr[0]) *
            1e-12) / 118698922.25997423) * 1838773899538452.5;
  local_6b8 = log10(dVar73);
  dVar77 = exp(-1.5e+33);
  local_5d8 = dVar77 * 0.19999999999999996 + 0.8;
  local_6c8 = log10(local_5d8);
  dVar71 = local_6c8 * -1.27 + 0.75;
  local_5e8._8_4_ = extraout_XMM0_Dc;
  local_5e8._0_8_ = dVar71;
  local_5e8._12_4_ = extraout_XMM0_Dd;
  dVar16 = local_6c8 * -0.67 + -0.4 + local_6b8;
  local_6b8 = 1.0 / (dVar16 * -0.14 + dVar71);
  dVar16 = dVar16 * local_6b8;
  dVar56 = 1.0 / (dVar16 * dVar16 + 1.0);
  dVar71 = pow(10.0,local_6c8 * dVar56);
  dVar50 = 0.43429448190325176 / local_5d8;
  dVar45 = (local_6c8 + local_6c8) * dVar56 * dVar56 * dVar16 * local_6b8;
  local_6b8 = -(double)local_5e8._0_8_ * dVar45 * local_6b8;
  dVar71 = dVar71 * (dVar73 / (dVar73 + 1.0));
  dVar52 = ((double)local_5f8._0_8_ * 118698922.25997423 + conc.arr[6] * -11503468.582662737) *
           dVar71;
  dVar46 = local_718[1] - dVar52;
  local_718[1] = dVar46;
  local_5d8 = local_718[3] - dVar52;
  local_718[3] = local_5d8;
  local_718[6] = dVar52 + local_718[6];
  local_648[0] = 0.0;
  local_648[1] = dVar71 * 118698922.25997423 * dVar17 + 0.0;
  local_648[2] = 0.0;
  local_648[3] = dVar71 * 118698922.25997423 * local_6a8 + 0.0;
  local_648[4] = 0.0;
  auStack_620._0_8_ = 0;
  auStack_620._8_8_ = dVar71 * -11503468.582662737 + 0.0;
  local_610._0_16_ = ZEXT816(0);
  pdVar36 = local_4c8 + 1;
  for (lVar43 = 0; lVar43 != 9; lVar43 = lVar43 + 1) {
    dVar48 = local_648[lVar43];
    *pdVar36 = *pdVar36 - dVar48;
    pdVar36[2] = pdVar36[2] - dVar48;
    pdVar36[5] = dVar48 + pdVar36[5];
    pdVar36 = pdVar36 + 10;
  }
  dVar73 = dVar71 * ((double)local_5f8._0_8_ * 47479.56890398969 + conc.arr[6] * -130017.75806443932
                    ) +
           (local_6b8 * -0.0006207345732258481 +
            (dVar45 * dVar16 * -1.27 + local_6b8 * -0.67 + dVar56) *
            ((dVar77 * 0.19999999999999996) / -1e-30 + -8e-31) * dVar50 +
           -0.0006207345732258481 / (dVar73 + 1.0)) * 2.302585092994046 * dVar52;
  pdVar36 = local_4c8 + 7;
  local_1f8[1] = local_1f8[1] - dVar73;
  dStack_1e0 = dStack_1e0 - dVar73;
  dStack_1c8 = dVar73 + dStack_1c8;
  dVar16 = dVar81 * 11.0 + dVar72 * 1.5 + dVar61;
  dVar61 = ((dVar16 * 1e-06) / 25936106.98548031) * 28231227327.532616;
  local_6b8 = conc.arr[7];
  local_6c8 = log10(dVar61);
  dVar73 = exp(-1.5e+33);
  dVar50 = dVar73 * 0.5 + 0.5;
  dVar77 = log10(dVar50);
  dVar45 = dVar77 * -1.27 + 0.75;
  dVar71 = dVar77 * -0.67 + -0.4 + local_6c8;
  local_6c8 = 1.0 / (dVar71 * -0.14 + dVar45);
  dVar71 = dVar71 * local_6c8;
  dVar56 = 1.0 / (dVar71 * dVar71 + 1.0);
  local_5e8._0_8_ = dVar71;
  dVar71 = pow(10.0,dVar77 * dVar56);
  dVar77 = (dVar77 + dVar77) * dVar56 * dVar56 * (double)local_5e8._0_8_ * local_6c8;
  local_6c8 = -dVar45 * dVar77 * local_6c8;
  dVar71 = dVar71 * (dVar61 / (dVar61 + 1.0));
  dVar45 = (local_6b8 * 25936106.98548031 + conc.arr[5] * conc.arr[5] * -3419315.29664768) * dVar71;
  local_718[5] = dVar45 + dVar45 + local_718[5];
  local_718[7] = local_718[7] - dVar45;
  local_648[0] = 0.0;
  local_648[1] = 0.0;
  local_648[2] = 0.0;
  local_648[3] = 0.0;
  local_648[4] = 0.0;
  auStack_620._8_8_ = 0;
  auStack_620._0_8_ = dVar71 * 3419315.29664768 * -2.0 * conc.arr[5] + 0.0;
  local_610._8_8_ = 0;
  local_610._0_8_ = dVar71 * 25936106.98548031 + 0.0;
  for (lVar43 = 0; lVar43 != 9; lVar43 = lVar43 + 1) {
    dVar52 = local_648[lVar43];
    pdVar36[-2] = dVar52 + dVar52 + pdVar36[-2];
    *pdVar36 = *pdVar36 - dVar52;
    pdVar36 = pdVar36 + 10;
  }
  dVar61 = dVar71 * (local_6b8 * 280925.8837546357 +
                    ((h_RT[5] + h_RT[5] + 5.101694818407498 + -1.0) * -0.0006666666666666666 +
                    0.010831459166632262) * -3419315.29664768 * conc.arr[5] * conc.arr[5]) +
           (local_6c8 * -0.0002845931413337665 +
            (dVar77 * (double)local_5e8._0_8_ * -1.27 + local_6c8 * -0.67 + dVar56) *
            ((dVar73 * 0.5) / -1e-30 + -4.9999999999999995e-31) * (0.43429448190325176 / dVar50) +
           -0.0002845931413337665 / (dVar61 + 1.0)) * 2.302585092994046 * dVar45;
  local_1d0 = dVar61 + dVar61 + local_1d0;
  local_1c0 = local_1c0 - dVar61;
  local_648[1] = dVar72 * 1.0145869685785861e-06 + dVar17 * dVar17 * -407.1662961015109;
  dVar61 = dVar16 * local_648[1];
  local_718[0] = local_718[0] - dVar61;
  local_718[3] = dVar61 + dVar61 + local_5d8;
  local_648[0] = local_648[1] * 2.5 + dVar16 * 1.0145869685785861e-06;
  local_648[2] = local_648[1] * 12.0;
  local_648[3] = dVar16 * 407.1662961015109 * -2.0 * dVar17 + local_648[1];
  local_648[4] = local_648[1];
  uVar44 = (undefined4)((ulong)local_648[1] >> 0x20);
  local_610._8_4_ = SUB84(local_648[1],0);
  local_610._0_8_ = local_648[1];
  local_610._12_4_ = uVar44;
  auStack_620._8_4_ = SUB84(local_648[1],0);
  auStack_620._0_8_ = local_648[1];
  auStack_620._12_4_ = uVar44;
  for (lVar43 = 0; lVar43 != 9; lVar43 = lVar43 + 1) {
    dVar61 = local_648[lVar43];
    *pdVar37 = *pdVar37 - dVar61;
    pdVar37[3] = dVar61 + dVar61 + pdVar37[3];
    pdVar37 = pdVar37 + 10;
  }
  dVar72 = (dVar72 * 2.2738361995042403e-08 +
           ((((h_RT[3] + h_RT[3]) - h_RT[0]) + -1.0) * -0.0006666666666666666 + 0.022411446922976298
           ) * -407.1662961015109 * dVar17 * dVar17) * dVar16;
  pdVar37 = local_4c8 + 1;
  local_1f8[0] = local_1f8[0] - dVar72;
  dStack_1e0 = dVar72 + dVar72 + dStack_1e0;
  local_648[3] = conc.arr[4] * conc.arr[4] * 159.17961552912485 +
                 local_6a8 * -2.0846475553480232e-08;
  dVar72 = dVar16 * local_648[3];
  local_718[1] = dVar46 + dVar72;
  local_648[0] = local_648[3] * 2.5;
  local_648[1] = dVar16 * -2.0846475553480232e-08 + local_648[3];
  local_648[2] = local_648[3] * 12.0;
  local_648[4] = (dVar16 * 159.17961552912485 + dVar16 * 159.17961552912485) * conc.arr[4] +
                 local_648[3];
  uVar44 = (undefined4)((ulong)local_648[3] >> 0x20);
  local_610._8_4_ = SUB84(local_648[3],0);
  local_610._0_8_ = local_648[3];
  local_610._12_4_ = uVar44;
  auStack_620._8_4_ = SUB84(local_648[3],0);
  auStack_620._0_8_ = local_648[3];
  auStack_620._12_4_ = uVar44;
  for (lVar43 = 0; lVar43 != 9; lVar43 = lVar43 + 1) {
    dVar61 = local_648[lVar43];
    *pdVar37 = *pdVar37 + dVar61;
    pdVar37[3] = pdVar37[3] - (dVar61 + dVar61);
    pdVar37 = pdVar37 + 10;
  }
  dVar73 = (conc.arr[4] * conc.arr[4] * -0.05305987184304161 +
           (((h_RT[1] - (h_RT[4] + h_RT[4])) + 1.0) * -0.0006666666666666666 +
           -0.0003333333333333333) * -2.0846475553480232e-08 * local_6a8) * dVar16;
  pdVar37 = local_4c8 + 5;
  dVar61 = local_1f8[1] + dVar73;
  local_1f8[1] = dVar61;
  dStack_1d8 = dStack_1d8 - (dVar73 + dVar73);
  local_648[1] = conc.arr[4] * dVar17 * 3142.6666666666665 + conc.arr[5] * -5.646680545093694e-06;
  dVar73 = dVar16 * local_648[1];
  local_718[3] = local_718[3] - dVar73;
  dVar72 = (local_718[4] - (dVar72 + dVar72)) - dVar73;
  local_718[5] = dVar73 + local_718[5];
  local_648[0] = local_648[1] * 2.5;
  local_648[2] = local_648[1] * 12.0;
  local_648[3] = local_648[1] + conc.arr[4] * dVar16 * 3142.6666666666665;
  local_648[4] = local_648[1] + dVar17 * dVar16 * 3142.6666666666665;
  auStack_620._0_8_ = dVar16 * -5.646680545093694e-06 + local_648[1];
  auStack_620._8_8_ = local_648[1];
  local_610._0_8_ = local_648[1];
  local_610._8_8_ = local_648[1];
  auVar1._8_4_ = SUB84(dVar72,0);
  auVar1._0_8_ = local_718[3];
  auVar1._12_4_ = (int)((ulong)dVar72 >> 0x20);
  local_718[4] = auVar1._8_8_;
  for (lVar43 = 0; lVar43 != 9; lVar43 = lVar43 + 1) {
    dVar73 = local_648[lVar43];
    pdVar37[-2] = pdVar37[-2] - dVar73;
    pdVar37[-1] = pdVar37[-1] - dVar73;
    *pdVar37 = dVar73 + *pdVar37;
    pdVar37 = pdVar37 + 10;
  }
  dVar73 = (conc.arr[4] * dVar17 * -2.095111111111111 +
           (((h_RT[5] - (h_RT[3] + h_RT[4])) + 1.0) * -0.0006666666666666666 +
           -0.0006666666666666666) * -5.646680545093694e-06 * conc.arr[5]) * dVar16;
  pdVar37 = local_4c8 + 2;
  dStack_1e0 = dStack_1e0 - dVar73;
  dStack_1d8 = dStack_1d8 - dVar73;
  local_1d0 = dVar73 + local_1d0;
  dVar73 = dVar17 * conc.arr[5];
  local_648[1] = dVar73 * 16888.888888888887 + dVar81 * -1.4321870058604512e-06;
  dVar77 = dVar16 * local_648[1];
  local_718[2] = local_718[2] + dVar77;
  local_648[0] = local_648[1] * 2.5;
  local_648[2] = dVar16 * -1.4321870058604512e-06 + local_648[1] * 12.0;
  local_648[3] = local_648[1] + conc.arr[5] * dVar16 * 16888.888888888887;
  local_648[4] = local_648[1];
  auStack_620._8_8_ = local_648[1];
  auStack_620._0_8_ = dVar16 * 16888.888888888887 * dVar17 + local_648[1];
  local_610._8_8_ = local_648[1];
  local_610._0_8_ = local_648[1];
  for (lVar43 = 0; lVar43 != 9; lVar43 = lVar43 + 1) {
    dVar71 = local_648[lVar43];
    *pdVar37 = *pdVar37 + dVar71;
    pdVar37[1] = pdVar37[1] - dVar71;
    pdVar37[3] = pdVar37[3] - dVar71;
    pdVar37 = pdVar37 + 10;
  }
  dVar16 = dVar16 * (dVar73 * -22.518518518518515 +
                    (((h_RT[2] - (h_RT[3] + h_RT[5])) + 1.0) * -0.0006666666666666666 +
                    -0.0013333333333333333) * -1.4321870058604512e-06 * dVar81);
  dVar59 = (double)local_5f8._0_8_ * 694956.7634748495 +
           conc.arr[5] * conc.arr[4] * -9534710.169227276;
  dVar83 = (double)local_5f8._0_8_ * 2391.8538305613447 +
           (0.0034417304158633542 -
           ((h_RT[4] + h_RT[5]) - (h_RT[1] + h_RT[3])) * 0.0006666666666666666) * -9534710.169227276
           * conc.arr[5] * conc.arr[4];
  dVar17 = dVar17 * 694956.7634748495;
  dVar81 = (local_718[5] - dVar77) + dVar59;
  auVar9._8_4_ = SUB84(dVar17 + local_4c8[0xf],0);
  auVar9._0_8_ = dVar17 + local_4c8[0xe];
  auVar9._12_4_ = (int)((ulong)(dVar17 + local_4c8[0xf]) >> 0x20);
  local_4c8[0xf] = auVar9._8_8_;
  dVar47 = conc.arr[4] * -9534710.169227276;
  auVar2._8_4_ = SUB84(dVar81,0);
  auVar2._0_8_ = dVar72 + dVar59;
  auVar2._12_4_ = (int)((ulong)dVar81 >> 0x20);
  local_718[5] = auVar2._8_8_;
  dVar62 = conc.arr[4] * 1860366.9115799016;
  local_4c8[4] = local_4c8[4] - dVar62;
  dVar48 = conc.arr[5] * -1341454.8115373214;
  local_6a8 = local_6a8 * 694956.7634748495;
  local_4c8[0x22] = (local_6a8 + local_4c8[0x22]) - dVar48;
  dVar45 = conc.arr[0] * 1860366.9115799016;
  dVar81 = conc.arr[5] * -9534710.169227276;
  auVar3._8_4_ = SUB84(local_4c8[0x29] - dVar81,0);
  auVar3._0_8_ = local_4c8[0x28] - dVar45;
  auVar3._12_4_ = (int)((ulong)(local_4c8[0x29] - dVar81) >> 0x20);
  local_4c8[0x2b] = (local_4c8[0x2b] - dVar81) + dVar45;
  dVar71 = dVar45 + dVar81 + local_4c8[0x2d];
  dVar81 = (dVar81 + local_4c8[0x2c]) - dVar45;
  auVar10._8_4_ = SUB84(dVar71,0);
  auVar10._0_8_ = dVar81;
  auVar10._12_4_ = (int)((ulong)dVar71 >> 0x20);
  dVar53 = conc.arr[5] * 4271828.084344627;
  local_4c8[2] = dVar53 + local_4c8[2];
  local_4c8[5] = (dVar62 + local_4c8[5]) - dVar53;
  dVar58 = conc.arr[2] * -145376.75098299314;
  dVar71 = dVar58 + (local_4c8[0x21] - local_6a8) + dVar48;
  auVar11._8_4_ = SUB84(dVar71,0);
  auVar11._0_8_ = dVar58 + local_4c8[0x20];
  auVar11._12_4_ = (int)((ulong)dVar71 >> 0x20);
  dVar63 = conc.arr[3] * -1341454.8115373214;
  dVar49 = conc.arr[3] * -145376.75098299314;
  dVar52 = conc.arr[4] * 86324.17110758815;
  local_4c8[0x14] = local_4c8[0x14] - dVar49;
  dVar74 = conc.arr[0] * 4271828.084344627;
  local_4c8[0x32] = (local_4c8[0x32] - dVar63) - dVar74;
  auVar33._8_4_ = SUB84(local_4c8[0x18] - dVar52,0);
  auVar33._0_8_ = local_4c8[0x17] + dVar49;
  auVar33._12_4_ = (int)((ulong)(local_4c8[0x18] - dVar52) >> 0x20);
  dVar66 = conc.arr[2] * 86324.17110758815;
  local_4c8[0x2a] = local_4c8[0x2a] - dVar66;
  local_4c8[0x2d] = auVar10._8_8_;
  dVar18 = conc.arr[5] * -3658126.0115307234;
  dVar54 = conc.arr[0] * conc.arr[5] * 7577.3366907946565 +
           (0.0017737925172045287 -
           ((h_RT[3] + h_RT[2]) - (h_RT[5] + h_RT[0])) * 0.0006666666666666666) *
           -145376.75098299314 * conc.arr[3] * conc.arr[2];
  dVar57 = conc.arr[0] * conc.arr[4] * 5928.561733942619 +
           (0.0031867701457385282 -
           ((h_RT[5] + h_RT[3]) - (h_RT[4] + h_RT[0])) * 0.0006666666666666666) *
           -1341454.8115373214 * dVar73;
  dVar71 = conc.arr[1] * -0.32384379658070717;
  dVar91 = dVar71 + ((local_4c8[0] - dVar62) - dVar53);
  auVar24._8_4_ = SUB84(dVar71 + local_4c8[1],0);
  auVar24._0_8_ = dVar91;
  auVar24._12_4_ = (int)((ulong)(dVar71 + local_4c8[1]) >> 0x20);
  auVar12._8_4_ = SUB84(conc.arr[4],0);
  auVar12._0_8_ = conc.arr[6];
  auVar12._12_4_ = (int)((ulong)conc.arr[4] >> 0x20);
  dVar50 = conc.arr[6] * 12595057.621245861;
  dVar76 = dVar50 + ((local_4c8[0x1e] - dVar48) - dVar58);
  dVar56 = dVar50 + (local_4c8[0x1f] - local_6a8);
  auVar13._8_4_ = SUB84(dVar56,0);
  auVar13._0_8_ = dVar76;
  auVar13._12_4_ = (int)((ulong)dVar56 >> 0x20);
  local_4c8[0x21] = auVar11._8_8_;
  dVar19 = conc.arr[3] * 12595057.621245861;
  dVar75 = conc.arr[6] * 64119709.90701692;
  dVar20 = conc.arr[5] * -0.6025543492746578;
  dVar67 = conc.arr[5] * -32.62001221218423;
  dVar70 = conc.arr[1] * -0.6025543492746578;
  local_4c8[0xe] = (dVar17 + local_4c8[0xe]) - dVar20;
  dVar84 = conc.arr[6] * 32500000.0;
  local_4c8[0x29] = auVar3._8_8_;
  local_4c8[0x29] = local_4c8[0x29] + dVar84;
  local_4c8[0x28] = local_4c8[0x28] - dVar45;
  dVar87 = conc.arr[3] * 64119709.90701692;
  dVar89 = conc.arr[4] * 32500000.0;
  dVar56 = (local_2d0 - dVar19) - dVar87;
  auVar4._8_4_ = SUB84(dStack_2c8 - dVar89,0);
  auVar4._0_8_ = dVar56;
  auVar4._12_4_ = (int)((ulong)(dStack_2c8 - dVar89) >> 0x20);
  dStack_740 = auVar12._8_8_;
  dVar88 = conc.arr[6] * conc.arr[3];
  dVar78 = dVar88 * 12595057.621245861 + conc.arr[0] * conc.arr[1] * -0.32384379658070717;
  dVar45 = dVar88 * 2318.3152480739177 +
           (0.00018406547375879315 -
           ((h_RT[0] + h_RT[1]) - (h_RT[3] + h_RT[6])) * 0.0006666666666666666) *
           -0.32384379658070717 * conc.arr[0] * conc.arr[1];
  dVar46 = dVar45 + ((local_1f8[0] - dVar57) - dVar54);
  dVar61 = dVar45 + (dVar61 - dVar83);
  auVar5._8_4_ = SUB84(dVar61,0);
  auVar5._0_8_ = dVar46;
  auVar5._12_4_ = (int)((ulong)dVar61 >> 0x20);
  local_1f8[1] = auVar5._8_8_;
  dVar21 = dVar88 * 4230.445091721601 +
           (6.597729618328551e-05 -
           ((h_RT[5] + h_RT[5]) - (h_RT[3] + h_RT[6])) * 0.0006666666666666666) *
           -16.310006106092114 * conc.arr[5] * conc.arr[5];
  dVar61 = dStack_740 * conc.arr[6] * 0.0 +
           (0.0 - ((h_RT[5] + h_RT[1]) - (h_RT[6] + h_RT[4])) * 0.0006666666666666666) *
           -0.6025543492746578 * conc.arr[5] * conc.arr[1];
  auVar14._8_4_ = SUB84(dVar61,0);
  auVar14._0_8_ = dVar21;
  auVar14._12_4_ = (int)((ulong)dVar61 >> 0x20);
  dVar64 = conc.arr[6] * conc.arr[5] * 34143562.115192875 +
           conc.arr[1] * conc.arr[2] * -0.029876205886692417;
  dVar65 = conc.arr[6] * conc.arr[5] * -3795.2266287524203 +
           (-0.00011115497017997593 -
           ((h_RT[1] + h_RT[2]) - (h_RT[5] + h_RT[6])) * 0.0006666666666666666) *
           -0.029876205886692417 * conc.arr[1] * conc.arr[2];
  dVar51 = conc.arr[2] * -0.029876205886692417;
  dVar69 = conc.arr[0] * -0.32384379658070717;
  local_4c8[10] = dVar69 + local_4c8[10];
  local_4c8[0xc] = local_4c8[0xc] + dVar51;
  local_4c8[0xd] = (local_4c8[0xd] - dVar17) - dVar69;
  local_4c8[0xf] = (local_4c8[0xf] + dVar20) - dVar51;
  auVar34._8_4_ = SUB84(local_4c8[0x10] - dVar69,0);
  auVar34._0_8_ = local_4c8[0xf];
  auVar34._12_4_ = (int)((ulong)(local_4c8[0x10] - dVar69) >> 0x20);
  local_4c8[0x10] = auVar34._8_8_;
  dVar22 = conc.arr[1] * -0.029876205886692417;
  dVar61 = ((local_4c8[0x16] + dVar49) - dVar52) + dVar22;
  auVar25._8_4_ = SUB84(dVar61,0);
  auVar25._0_8_ = local_4c8[0x15] + dVar22;
  auVar25._12_4_ = (int)((ulong)dVar61 >> 0x20);
  dVar29 = (dVar52 + dVar52 + (local_4c8[0x19] - dVar49)) - dVar22;
  auVar26._8_4_ = SUB84(local_4c8[0x1a] - dVar22,0);
  auVar26._0_8_ = dVar29;
  auVar26._12_4_ = (int)((ulong)(local_4c8[0x1a] - dVar22) >> 0x20);
  dVar30 = conc.arr[6] * 15085094.926858293;
  dVar23 = conc.arr[6] * 34143562.115192875;
  local_4c8[0x33] = (local_4c8[0x33] - dVar47) + dVar70 + dVar23;
  dVar61 = conc.arr[5] * 34143562.115192875;
  dVar60 = conc.arr[4] * conc.arr[2];
  auVar27._8_4_ = SUB84(conc.arr[6] * conc.arr[6],0);
  auVar27._0_8_ = dVar60;
  auVar27._12_4_ = (int)((ulong)(conc.arr[6] * conc.arr[6]) >> 0x20);
  dVar31 = conc.arr[0] * conc.arr[5] * 4271828.084344627 +
           conc.arr[3] * conc.arr[2] * -145376.75098299314;
  dVar32 = conc.arr[0] * conc.arr[4] * 1860366.9115799016 + dVar73 * -1341454.8115373214;
  auVar28._8_4_ = SUB84(dVar32,0);
  auVar28._0_8_ = dVar31;
  auVar28._12_4_ = (int)((ulong)dVar32 >> 0x20);
  dVar90 = conc.arr[7] * conc.arr[1];
  dVar79 = dVar88 * 64119709.90701692 + conc.arr[5] * conc.arr[5] * -16.310006106092114;
  dVar82 = dStack_740 * conc.arr[6] * 32500000.0 + conc.arr[5] * conc.arr[1] * -0.6025543492746578;
  dVar88 = conc.arr[7] * -4.470666408692084;
  dVar73 = conc.arr[6] * -4323.663734083463;
  dStack_190 = conc.arr[5];
  auVar6._8_4_ = SUB84(conc.arr[7],0);
  auVar6._0_8_ = conc.arr[5];
  auVar6._12_4_ = (int)((ulong)conc.arr[7] >> 0x20);
  dVar80 = conc.arr[7] * -150.1634478502138;
  dVar52 = conc.arr[1] * -150.1634478502138;
  dStack_760 = auVar27._8_8_;
  dVar55 = dStack_760 * 20212.492175153773 +
           (0.0026797964842987356 -
           ((h_RT[1] + h_RT[7]) - (h_RT[6] + h_RT[6])) * 0.0006666666666666666) * -150.1634478502138
           * dVar90;
  dVar68 = dStack_760 * 7542547.463429146 + dVar90 * -150.1634478502138;
  local_4c8[0xb] = dVar69 + (local_4c8[0xb] - dVar17) + dVar20 + dVar51 + dVar80 + dVar88;
  local_4c8[0x10] = (((local_4c8[0x10] - dVar20) - dVar51) - (dVar80 + dVar80)) - (dVar88 + dVar88);
  local_4c8[0x11] = dVar88 + dVar80 + local_4c8[0x11];
  dVar85 = dVar60 * 374.95779706744673 +
           (0.00434360147634811 - (h_RT[5] * 2.0 + -(h_RT[4] + h_RT[2])) * 0.0006666666666666666) *
           -1829063.0057653617 * conc.arr[5] * conc.arr[5];
  dVar86 = dStack_760 * -81.82756742036453 +
           (-0.0003643959615980579 - (h_RT[6] * -2.0 + h_RT[1] + h_RT[7]) * 0.0006666666666666666) *
           -4.470666408692084 * dVar90;
  dVar17 = dVar54 + ((dStack_1e0 - dVar16) - dVar83) + dVar57;
  dVar80 = ((double)CONCAT44(uStack_1e4,local_1e8) + dVar16 + dVar54) - dVar85;
  auVar35._8_4_ = SUB84(dVar17,0);
  auVar35._0_8_ = dVar80;
  auVar35._12_4_ = (int)((ulong)dVar17 >> 0x20);
  dStack_1e0 = auVar35._8_8_;
  local_5e8._8_8_ = auVar14._8_8_;
  dStack_750 = auVar28._8_8_;
  dVar69 = dVar60 * 86324.17110758815 + conc.arr[5] * conc.arr[5] * -1829063.0057653617;
  dVar88 = dStack_760 * 224556.7351007675 + dVar90 * -4.470666408692084;
  dVar17 = conc.arr[6] * 449113.470201535;
  dStack_2e0 = dVar19 + dStack_2e0 + dVar89 + dVar61 + dVar30 + dVar17;
  auVar7._8_4_ = SUB84(conc.arr[5],0);
  auVar7._0_8_ = conc.arr[2];
  auVar7._12_4_ = (int)((ulong)conc.arr[5] >> 0x20);
  dVar20 = conc.arr[5] * -7.112730406981104e-05;
  local_4c8[0x16] = auVar25._8_8_;
  local_4c8[0x18] = auVar33._8_8_;
  local_4c8[0x17] = (local_4c8[0x17] + dVar49) - dVar20;
  local_4c8[0x1a] = auVar26._8_8_;
  dVar60 = conc.arr[7] * 6362141.693962547;
  local_4c8[0x23] = dVar75 + dVar75 + ((local_6a8 + local_4c8[0x23] + dVar48) - dVar58) + dVar60;
  dVar48 = conc.arr[2] * -7.112730406981104e-05;
  local_4c8[0x35] = (((local_4c8[0x35] - dVar47) + dVar63 + dVar74) - dVar67) - dVar48;
  local_178 = conc.arr[3];
  uStack_170 = 0;
  dVar49 = conc.arr[1] * -4.470666408692084;
  dVar51 = conc.arr[3] * 6362141.693962547;
  local_290 = local_290 + dVar52 + dVar49;
  local_4c8[1] = auVar24._8_8_;
  local_4c8[0] = dVar91 + dVar73;
  local_4c8[3] = ((dVar53 + local_4c8[3] + dVar62) - dVar71) - dVar73;
  local_4c8[6] = (local_4c8[6] - dVar71) + dVar73;
  local_4c8[7] = local_4c8[7] - dVar73;
  local_1a8 = conc.arr[7];
  uStack_1a0 = 0;
  dVar73 = conc.arr[7] * 3347824.3674030215;
  local_4c8[0x1f] = auVar13._8_8_;
  local_4c8[0x1e] = dVar76 + dVar73;
  local_4c8[0x21] = (((local_4c8[0x21] - dVar50) - dVar75) - dVar60) - dVar73;
  local_4c8[0x20] = dVar58 + local_4c8[0x20] + dVar60;
  local_4c8[0x24] = dVar73 + ((local_4c8[0x24] - dVar50) - dVar75);
  local_4c8[0x25] = (local_4c8[0x25] - dVar60) - dVar73;
  local_188 = h_RT[7];
  uStack_180 = 0;
  dVar73 = conc.arr[7] * 5672469.694980093;
  local_4c8[0x2d] = dVar73 + dVar66 + dVar66 + local_4c8[0x2d] + dVar84;
  local_4c8[0x2c] = ((dVar81 - dVar66) - dVar84) - dVar73;
  local_4c8[0x2e] = dVar73 + (local_4c8[0x2e] - dVar84);
  dVar81 = conc.arr[0] * -4323.663734083463;
  dVar71 = conc.arr[5] * -5282.492258864639;
  local_4c8[0x2f] = local_4c8[0x2f] - dVar73;
  local_198 = local_300 - dVar48;
  local_2e8 = dVar19 + local_2e8 + dVar81;
  dStack_2c8 = auVar4._8_8_;
  dStack_2c8 = dStack_2c8 - dVar71;
  local_2d0 = dVar56 - dVar81;
  dVar56 = conc.arr[3] * 3347824.3674030215;
  dVar58 = conc.arr[4] * 5672469.694980093;
  local_298 = local_298 + dVar56;
  dVar76 = conc.arr[4] * conc.arr[7] * 5672469.694980093 +
           conc.arr[6] * conc.arr[5] * -5282.492258864639;
  dVar66 = conc.arr[4] * conc.arr[7] * 12599.866574880663 +
           (0.0022212311836643283 -
           ((h_RT[6] + h_RT[5]) - (h_RT[4] + h_RT[7])) * 0.0006666666666666666) * -5282.492258864639
           * conc.arr[6] * conc.arr[5];
  local_718[4] = ((((dVar72 + dVar59) - dVar32) - dVar69) - dVar82) - dVar76;
  auVar8._8_4_ = SUB84((double)local_280._8_8_ - dVar58,0);
  auVar8._0_8_ = ((double)local_280._0_8_ - dVar51) - dVar56;
  auVar8._12_4_ = (int)((ulong)((double)local_280._8_8_ - dVar58) >> 0x20);
  local_280 = auVar8;
  dStack_1d8 = ((((dStack_1d8 + dVar83) - dVar57) - dVar85) - (double)local_5e8._8_8_) - dVar66;
  dVar91 = conc.arr[2] * -43.95116952269832;
  local_160 = (((dVar87 + dVar87 + local_2c0 + dVar89) - dVar61) + dVar71) - dVar91;
  local_158 = ((((((local_2b8 - dVar19) - dVar87) - dVar89) - dVar61) - (dVar30 + dVar30)) -
              (dVar17 + dVar17)) + dVar81 + dVar71 + dVar91;
  local_150 = (((dVar17 + dVar30 + local_2b0) - dVar81) - dVar71) - dVar91;
  dVar50 = conc.arr[7] * 1000000.0;
  dVar17 = conc.arr[5] * 1000000.0;
  dVar81 = conc.arr[6] * -5282.492258864639;
  dVar73 = conc.arr[7] * 23496864.50220335;
  dVar71 = conc.arr[6] * -43.95116952269832;
  dVar72 = conc.arr[6] * -1032.714674988212;
  local_4c8[0x16] = local_4c8[0x16] + dVar20 + dVar71 + dVar72;
  local_4c8[0x15] = local_4c8[0x15] + dVar22;
  local_4c8[0x1a] = dVar71 + local_4c8[0x1a] + dVar72;
  local_4c8[0x19] = ((dVar29 + dVar20) - dVar71) - dVar72;
  local_4c8[0x1b] = ((local_4c8[0x1b] - dVar20) - dVar71) - dVar72;
  dVar72 = ((((dVar67 + dVar67 +
               dVar18 + dVar18 + ((dVar63 + dVar47 + (double)auStack_318._8_8_) - dVar74) + dVar70)
             - dVar23) + dVar48 + dVar81) - dVar50) - dVar73;
  local_4c8[0x34] = ((local_4c8[0x34] + dVar74) - dVar18) + dVar23 + dVar48 + dVar50 + dVar73;
  auStack_318._8_4_ = SUB84(dVar72,0);
  auStack_318._0_8_ = (((((double)auStack_318._0_8_ + dVar47) - dVar63) - dVar18) - dVar70) - dVar81
  ;
  auStack_318._12_4_ = (int)((ulong)dVar72 >> 0x20);
  local_308 = (((local_308 - dVar67) - dVar70) - dVar23) + dVar81 + dVar50 + dVar73;
  local_300 = (((local_300 - dVar48) - dVar81) - dVar50) - dVar73;
  dVar72 = conc.arr[2] * -1032.714674988212;
  local_2d8 = dVar61 + local_2d8 + dVar91 + dVar72;
  local_2c0 = local_160 - dVar72;
  local_2b8 = local_158 + dVar72;
  local_2b0 = local_150 - dVar72;
  dVar72 = conc.arr[5] * 23496864.50220335;
  dStack_288 = dStack_288 + dVar51 + dVar17 + dVar72;
  local_270 = ((local_270 + dVar51 + dVar58) - dVar17) - dVar72;
  local_268 = ((local_268 - (dVar52 + dVar52)) - (dVar49 + dVar49)) + dVar56 + dVar58 + dVar17 +
              dVar72;
  local_260 = (((((dVar52 + local_260 + dVar49) - dVar51) - dVar56) - dVar58) - dVar17) - dVar72;
  dStack_6b0 = auVar7._8_8_;
  dVar50 = conc.arr[2] * conc.arr[6];
  dStack_80 = auVar6._8_8_;
  dVar73 = conc.arr[5] * conc.arr[7] * 0.0 +
           (0.0 - ((h_RT[6] + h_RT[2]) - (h_RT[7] + h_RT[5])) * 0.0006666666666666666) *
           -43.95116952269832 * dVar50;
  dVar71 = dStack_80 * conc.arr[3] * 5648.9319335705395 +
           (0.0008878978503309949 -
           ((h_RT[2] + h_RT[5]) - (h_RT[7] + h_RT[3])) * 0.0006666666666666666) *
           -7.112730406981104e-05 * dStack_6b0 * conc.arr[2];
  local_1f8[1] = dVar86 + dVar55 + local_1f8[1] + (double)local_5e8._8_8_ + dVar65;
  dVar17 = conc.arr[5] * conc.arr[7] * 50223.15555469926 +
           (0.0021374407444869816 -
           ((h_RT[6] + h_RT[2]) - (h_RT[5] + h_RT[7])) * 0.0006666666666666666) * -1032.714674988212
           * dVar50;
  dVar72 = conc.arr[7] * conc.arr[3] * 5952.53958938735 +
           (0.0017780322191766774 -
           ((h_RT[0] + h_RT[6]) - (h_RT[7] + h_RT[3])) * 0.0006666666666666666) * -4323.663734083463
           * conc.arr[0] * conc.arr[6];
  local_1f8[0] = dVar46 + dVar72;
  dVar81 = conc.arr[5] * conc.arr[7] * 1000000.0 + dVar50 * -43.95116952269832;
  dVar61 = dStack_80 * conc.arr[3] * 6362141.693962547 +
           dStack_6b0 * conc.arr[2] * -7.112730406981104e-05;
  local_718[1] = dVar78 + (local_718[1] - dVar59) + dVar82 + dVar64 + dVar68 + dVar88;
  dVar50 = conc.arr[5] * conc.arr[7] * 23496864.50220335 + dVar50 * -1032.714674988212;
  dVar56 = conc.arr[7] * conc.arr[3] * 3347824.3674030215 +
           conc.arr[0] * conc.arr[6] * -4323.663734083463;
  local_718[0] = dVar78 + ((local_718[0] - dVar32) - dVar31) + dVar56;
  local_718[2] = dVar64 + ((local_718[2] + dVar31) - dVar69) + dVar61 + dVar81 + dVar50;
  local_718[3] = ((((dVar31 + ((local_718[3] - dVar77) - dVar59) + dStack_750) - dVar78) - dVar79) -
                 dVar61) - dVar56;
  local_718[5] = ((((dVar79 + dVar79 + dVar69 * 2.0 + ((dVar32 + local_718[5]) - dVar31) + dVar82) -
                   dVar64) + dVar61 + dVar76) - dVar81) - dVar50;
  local_718[6] = dVar88 * -2.0 +
                 (((((local_718[6] - dVar78) - dVar79) - dVar82) - dVar64) - (dVar68 + dVar68)) +
                 dVar56 + dVar76 + dVar81 + dVar50;
  local_718[7] = (((((dVar88 + local_718[7] + dVar68) - dVar61) - dVar56) - dVar76) - dVar81) -
                 dVar50;
  dVar61 = dVar71 + dVar65 + dVar80 + dVar73 + dVar17;
  dVar81 = (((dStack_1e0 - dVar45) - dVar21) - dVar71) - dVar72;
  auVar15._8_4_ = SUB84(dVar81,0);
  auVar15._0_8_ = dVar61;
  auVar15._12_4_ = (int)((ulong)dVar81 >> 0x20);
  local_1e8 = SUB84(dVar61,0);
  uStack_1e4 = (undefined4)((ulong)dVar61 >> 0x20);
  dStack_1e0 = auVar15._8_8_;
  local_1d0 = ((((dVar21 + dVar21 +
                  dVar85 * 2.0 + ((dVar57 + dVar83 + (local_1d0 - dVar16)) - dVar54) +
                 (double)local_5e8._8_8_) - dVar65) + dVar71 + dVar66) - dVar73) - dVar17;
  dStack_1c8 = dVar86 * -2.0 +
               (((((dStack_1c8 - dVar45) - dVar21) - (double)local_5e8._8_8_) - dVar65) -
               (dVar55 + dVar55)) + dVar72 + dVar66 + dVar73 + dVar17;
  local_1c0 = (((((dVar86 + local_1c0 + dVar55) - dVar71) - dVar72) - dVar66) - dVar73) - dVar17;
  if (iVar42 == 0) {
    c_R[0] = 2.8916149455543745;
    c_R[1] = 3.3887808219431252;
    c_R[2] = 4.665255136408125;
    c_R[3] = 1.5;
    c_R[4] = 1.506900950283125;
    c_R[5] = 2.9628176357525002;
    c_R[6] = 5.2821630604062495;
    c_R[7] = 7.4795990834;
    c_R[8] = 3.1861205355625004;
    dcRdT[0] = 0.00049010354654;
    dcRdT[1] = 0.000340356715215;
    dcRdT[2] = 0.0011616005819375;
    dcRdT[3] = 0.0;
    dcRdT[4] = -1.20361935e-05;
    dcRdT[5] = 0.00046729736768999996;
    dcRdT[6] = 0.0009643321552500001;
    dcRdT[7] = 0.0013043066091500003;
    dcRdT[8] = 0.00037292866150000014;
    pRVar38 = local_78;
    local_78[0] = 1.9113420244977917;
    local_78[1] = 2.254512984911125;
    local_78[2] = -16.528347679998124;
    local_78[3] = 18.481084666666668;
    local_78[4] = 21.009669090999374;
    local_78[5] = 4.94295186894925;
    local_78[6] = 4.3818731557687505;
    local_78[7] = -6.101694818407498;
    local_78[8] = 2.079423216195834;
  }
  else {
    c_R[0] = 3.8916149455543745;
    c_R[1] = 4.388780821943126;
    c_R[2] = 5.665255136408124;
    c_R[3] = 2.5;
    c_R[4] = 2.506900950283125;
    c_R[5] = 3.9628176357525002;
    c_R[6] = 6.28216306040625;
    c_R[7] = 8.4795990834;
    c_R[8] = 4.1861205355625;
    dcRdT[0] = 0.00049010354654;
    dcRdT[1] = 0.000340356715215;
    dcRdT[2] = 0.0011616005819375;
    dcRdT[3] = 0.0;
    dcRdT[4] = -1.20361935e-05;
    dcRdT[5] = 0.00046729736768999996;
    dcRdT[6] = 0.0009643321552500001;
    dcRdT[7] = 0.0013043066091500003;
    dcRdT[8] = 0.00037292866150000014;
    pRVar38 = h_RT;
  }
  dVar17 = 0.0;
  dVar72 = 0.0;
  dVar81 = 0.0;
  dVar61 = 0.0;
  for (lVar43 = 0; lVar43 != 0x48; lVar43 = lVar43 + 8) {
    dVar73 = *(double *)((long)conc.arr + lVar43);
    dVar81 = dVar81 + *(double *)((long)dcRdT + lVar43) * dVar73;
    dVar77 = *(double *)((long)pRVar38 + lVar43);
    dVar17 = dVar17 + dVar73 * *(double *)((long)c_R + lVar43);
    dVar72 = dVar72 + *(double *)((long)local_718 + lVar43) * dVar77;
    dVar61 = dVar61 + (*(double *)((long)c_R + lVar43) - dVar77) * 0.0006666666666666666 *
                      *(double *)((long)local_718 + lVar43) +
                      dVar77 * *(double *)((long)local_1f8 + lVar43);
  }
  dVar72 = dVar72 * (1.0 / dVar17);
  dVar17 = (1.0 / dVar17) * 1500.0;
  dVar73 = dVar72 * dVar17;
  dVar17 = -dVar17;
  pdVar37 = local_4c8;
  for (lVar43 = 0; lVar43 != 9; lVar43 = lVar43 + 1) {
    dVar77 = 0.0;
    for (lVar39 = 0; lVar39 != 9; lVar39 = lVar39 + 1) {
      dVar77 = dVar77 + pRVar38[lVar39] * pdVar37[lVar39];
    }
    local_4c8[lVar43 * 10 + 9] = c_R[lVar43] * dVar73 + dVar77 * dVar17;
    pdVar37 = pdVar37 + 10;
  }
  local_1b0 = dVar17 * dVar61 + (dVar73 * dVar81 - dVar72);
  if (base == 1) {
    *rowPtr = 1;
    pdVar37 = local_4c8;
    lVar43 = 0;
    lVar39 = 0;
    iVar42 = 1;
    while (lVar39 != 10) {
      lVar39 = lVar39 + 1;
      iVar41 = 1;
      for (lVar40 = 0; lVar40 != 800; lVar40 = lVar40 + 0x50) {
        if (lVar43 == lVar40) {
          colVals[(long)iVar42 + -1] = (int)lVar39;
LAB_0013900b:
          iVar42 = iVar42 + 1;
        }
        else if ((*(double *)((long)pdVar37 + lVar40) != 0.0) ||
                (NAN(*(double *)((long)pdVar37 + lVar40)))) {
          colVals[(long)iVar42 + -1] = iVar41;
          goto LAB_0013900b;
        }
        iVar41 = iVar41 + 1;
      }
      rowPtr[lVar39] = iVar42;
      pdVar37 = pdVar37 + 1;
      lVar43 = lVar43 + 0x50;
    }
  }
  else {
    *rowPtr = 0;
    pdVar37 = local_4c8;
    iVar42 = 0;
    for (lVar43 = 0; lVar43 != 10; lVar43 = lVar43 + 1) {
      pdVar36 = pdVar37;
      for (lVar39 = 0; lVar39 != 10; lVar39 = lVar39 + 1) {
        if (lVar43 == lVar39) {
          colVals[iVar42] = (int)lVar43;
LAB_00139069:
          iVar42 = iVar42 + 1;
        }
        else if ((*pdVar36 != 0.0) || (NAN(*pdVar36))) {
          colVals[iVar42] = (int)lVar39;
          goto LAB_00139069;
        }
        pdVar36 = pdVar36 + 10;
      }
      rowPtr[lVar43 + 1] = iVar42;
      pdVar37 = pdVar37 + 1;
    }
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(
  int* colVals, int* rowPtr, const int* consP, int base)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian_precond(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtr[0] = 1;
    int nJdata_tmp = 1;
    for (int l = 0; l < 10; l++) {
      for (int k = 0; k < 10; k++) {
        if (k == l) {
          colVals[nJdata_tmp - 1] = l + 1;
          nJdata_tmp = nJdata_tmp + 1;
        } else {
          if (Jac[10 * k + l] != 0.0) {
            colVals[nJdata_tmp - 1] = k + 1;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
      }
      rowPtr[l + 1] = nJdata_tmp;
    }
  } else {
    rowPtr[0] = 0;
    int nJdata_tmp = 0;
    for (int l = 0; l < 10; l++) {
      for (int k = 0; k < 10; k++) {
        if (k == l) {
          colVals[nJdata_tmp] = l;
          nJdata_tmp = nJdata_tmp + 1;
        } else {
          if (Jac[10 * k + l] != 0.0) {
            colVals[nJdata_tmp] = k;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
      }
      rowPtr[l + 1] = nJdata_tmp;
    }
  }
}